

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::UnitTestImpl(UnitTestImpl *this,UnitTest *parent)

{
  TestEventListeners *listener;
  PrettyUnitTestResultPrinter *this_00;
  UnitTest *in_RSI;
  UnitTestImpl *in_RDI;
  UnitTestImpl *in_stack_ffffffffffffff28;
  TestResult *in_stack_ffffffffffffff30;
  TestEventListeners *this_01;
  TestPartResultReporterInterface **in_stack_ffffffffffffff48;
  TestEventListeners *in_stack_ffffffffffffff50;
  Mutex *in_stack_ffffffffffffff60;
  
  in_RDI->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_00206e60;
  in_RDI->parent_ = in_RSI;
  FilePath::FilePath((FilePath *)in_stack_ffffffffffffff50);
  DefaultGlobalTestPartResultReporter::DefaultGlobalTestPartResultReporter
            ((DefaultGlobalTestPartResultReporter *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  DefaultPerThreadTestPartResultReporter::DefaultPerThreadTestPartResultReporter
            ((DefaultPerThreadTestPartResultReporter *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  in_RDI->global_test_part_result_reporter_ =
       &(in_RDI->default_global_test_part_result_reporter_).super_TestPartResultReporterInterface;
  Mutex::Mutex(in_stack_ffffffffffffff60);
  ThreadLocal<testing::TestPartResultReporterInterface_*>::ThreadLocal
            ((ThreadLocal<testing::TestPartResultReporterInterface_*> *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::vector
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)0x1a89be);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::vector
            ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)0x1a89d7);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>_>_>
                   *)0x1a89f0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a8a09);
  (in_RDI->parameterized_test_registry_).suite_name_to_info_index_._M_h._M_rehash_policy.
  _M_next_resize = 0;
  (in_RDI->parameterized_test_registry_).suite_name_to_info_index_._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (in_RDI->parameterized_test_registry_).suite_name_to_info_index_._M_h._M_element_count = 0;
  *(undefined8 *)
   &(in_RDI->parameterized_test_registry_).suite_name_to_info_index_._M_h._M_rehash_policy = 0;
  (in_RDI->parameterized_test_registry_).suite_name_to_info_index_._M_h._M_bucket_count = 0;
  (in_RDI->parameterized_test_registry_).suite_name_to_info_index_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (in_RDI->parameterized_test_registry_).test_suite_infos_.
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->parameterized_test_registry_).suite_name_to_info_index_._M_h._M_buckets =
       (__buckets_ptr)0x0;
  (in_RDI->parameterized_test_registry_).test_suite_infos_.
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->parameterized_test_registry_).test_suite_infos_.
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ParameterizedTestSuiteRegistry::ParameterizedTestSuiteRegistry
            ((ParameterizedTestSuiteRegistry *)in_stack_ffffffffffffff30);
  TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteRegistry
            ((TypeParameterizedTestSuiteRegistry *)0x1a8a64);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1a8a7d);
  in_RDI->parameterized_tests_registered_ = false;
  in_RDI->last_death_test_suite_ = -1;
  in_RDI->current_test_suite_ = (TestSuite *)0x0;
  in_RDI->current_test_info_ = (TestInfo *)0x0;
  TestResult::TestResult(in_stack_ffffffffffffff30);
  TestEventListeners::TestEventListeners(in_stack_ffffffffffffff50);
  in_RDI->os_stack_trace_getter_ = (OsStackTraceGetterInterface *)0x0;
  in_RDI->post_flag_parse_init_performed_ = false;
  in_RDI->random_seed_ = 0;
  Random::Random(&in_RDI->random_,0);
  in_RDI->start_timestamp_ = 0;
  in_RDI->elapsed_time_ = 0;
  std::
  unique_ptr<testing::internal::InternalRunDeathTestFlag,std::default_delete<testing::internal::InternalRunDeathTestFlag>>
  ::unique_ptr<std::default_delete<testing::internal::InternalRunDeathTestFlag>,void>
            ((unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
              *)in_stack_ffffffffffffff30);
  operator_new(8);
  DefaultDeathTestFactory::DefaultDeathTestFactory
            ((DefaultDeathTestFactory *)in_stack_ffffffffffffff30);
  std::
  unique_ptr<testing::internal::DeathTestFactory,std::default_delete<testing::internal::DeathTestFactory>>
  ::unique_ptr<std::default_delete<testing::internal::DeathTestFactory>,void>
            ((unique_ptr<testing::internal::DeathTestFactory,_std::default_delete<testing::internal::DeathTestFactory>_>
              *)in_stack_ffffffffffffff30,(pointer)in_stack_ffffffffffffff28);
  this_01 = (TestEventListeners *)&in_RDI->gtest_trace_stack_;
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::ThreadLocal((ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
                 *)this_01);
  in_RDI->catch_exceptions_ = false;
  listener = listeners(in_RDI);
  this_00 = (PrettyUnitTestResultPrinter *)operator_new(8);
  PrettyUnitTestResultPrinter::PrettyUnitTestResultPrinter(this_00);
  TestEventListeners::SetDefaultResultPrinter(this_01,(TestEventListener *)listener);
  return;
}

Assistant:

UnitTestImpl::UnitTestImpl(UnitTest* parent)
    : parent_(parent),
      GTEST_DISABLE_MSC_WARNINGS_PUSH_(4355 /* using this in initializer */)
          default_global_test_part_result_reporter_(this),
      default_per_thread_test_part_result_reporter_(this),
      GTEST_DISABLE_MSC_WARNINGS_POP_() global_test_part_result_reporter_(
          &default_global_test_part_result_reporter_),
      per_thread_test_part_result_reporter_(
          &default_per_thread_test_part_result_reporter_),
      parameterized_test_registry_(),
      parameterized_tests_registered_(false),
      last_death_test_suite_(-1),
      current_test_suite_(nullptr),
      current_test_info_(nullptr),
      ad_hoc_test_result_(),
      os_stack_trace_getter_(nullptr),
      post_flag_parse_init_performed_(false),
      random_seed_(0),  // Will be overridden by the flag before first use.
      random_(0),       // Will be reseeded before first use.
      start_timestamp_(0),
      elapsed_time_(0),
#ifdef GTEST_HAS_DEATH_TEST
      death_test_factory_(new DefaultDeathTestFactory),
#endif
      // Will be overridden by the flag before first use.
      catch_exceptions_(false) {
  listeners()->SetDefaultResultPrinter(new PrettyUnitTestResultPrinter);
}